

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

void lyd_insert_meta(lyd_node *parent,lyd_meta *meta,ly_bool clear_dflt)

{
  lyd_meta *plVar1;
  lyd_meta **pplVar2;
  lyd_meta *plVar3;
  
  if (parent == (lyd_node *)0x0) {
    __assert_fail("parent",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x4f3,"void lyd_insert_meta(struct lyd_node *, struct lyd_meta *, ly_bool)");
  }
  plVar1 = meta;
  if (meta != (lyd_meta *)0x0) {
    do {
      plVar1->parent = parent;
      pplVar2 = &plVar1->next;
      plVar1 = *pplVar2;
    } while (*pplVar2 != (lyd_meta *)0x0);
    plVar1 = parent->meta;
    if (parent->meta == (lyd_meta *)0x0) {
      pplVar2 = &parent->meta;
    }
    else {
      do {
        plVar3 = plVar1;
        plVar1 = plVar3->next;
      } while (plVar1 != (lyd_meta *)0x0);
      pplVar2 = &plVar3->next;
    }
    *pplVar2 = meta;
    if (clear_dflt != '\0') {
      lyd_np_cont_dflt_del(parent);
      return;
    }
  }
  return;
}

Assistant:

void
lyd_insert_meta(struct lyd_node *parent, struct lyd_meta *meta, ly_bool clear_dflt)
{
    struct lyd_meta *last, *iter;

    assert(parent);

    if (!meta) {
        return;
    }

    for (iter = meta; iter; iter = iter->next) {
        iter->parent = parent;
    }

    /* insert as the last attribute */
    if (parent->meta) {
        for (last = parent->meta; last->next; last = last->next) {}
        last->next = meta;
    } else {
        parent->meta = meta;
    }

    /* remove default flags from NP containers */
    if (clear_dflt) {
        lyd_np_cont_dflt_del(parent);
    }
}